

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trainer.h
# Opt level: O0

void __thiscall xLearn::Trainer::~Trainer(Trainer *this)

{
  vector<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_> *unaff_retaddr;
  
  std::vector<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_>::~vector(unaff_retaddr);
  std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::~vector
            ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)unaff_retaddr);
  return;
}

Assistant:

~Trainer() {}